

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase881::run(TestCase881 *this)

{
  Reader reader;
  Builder builder_00;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  Builder root;
  MallocMessageBuilder builder;
  OrphanBuilder local_1f0;
  ListElementCount local_1cc;
  ListReader local_1c8;
  PointerBuilder local_190;
  StructBuilder local_178;
  void *in_stack_fffffffffffffec0;
  WirePointer *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  SegmentReader *in_stack_fffffffffffffed8;
  CapTableReader *in_stack_fffffffffffffee0;
  void *local_118;
  WirePointer *pWStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1f0,&local_f8.super_MessageBuilder);
  local_1c8.ptr = (byte *)local_1f0.capTable;
  local_1c8.segment = (SegmentReader *)local_1f0.tag.content;
  local_1c8.capTable = (CapTableReader *)local_1f0.segment;
  PointerBuilder::initStruct(&local_178,(PointerBuilder *)&local_1c8,(StructSize)0x140006);
  local_190.pointer = local_178.pointers + 2;
  local_190.segment = local_178.segment;
  local_190.capTable = local_178.capTable;
  PointerBuilder::disown((OrphanBuilder *)&local_1c8,&local_190);
  local_1f0.capTable = (CapTableBuilder *)local_1c8.ptr;
  local_1f0.location = (word *)CONCAT44(local_1c8.step,local_1c8.elementCount);
  local_1f0.tag.content = (uint64_t)local_1c8.segment;
  local_1f0.segment = (SegmentBuilder *)local_1c8.capTable;
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x377,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::asStructReader
            ((StructReader *)&stack0xfffffffffffffed8,&local_1f0,(StructSize)0x140006);
  reader._reader.capTable = in_stack_fffffffffffffee0;
  reader._reader.segment = in_stack_fffffffffffffed8;
  reader._reader.data = local_118;
  reader._reader.pointers = pWStack_110;
  reader._reader._32_8_ = local_108;
  reader._reader._40_8_ = uStack_100;
  checkTestMessageAllZero(reader);
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37a,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::asStruct((StructBuilder *)&stack0xfffffffffffffeb0,&local_1f0,(StructSize)0x140006)
  ;
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffec8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffec0;
  builder_00._builder.data = (void *)in_stack_fffffffffffffed0;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffed8;
  builder_00._builder._32_8_ = in_stack_fffffffffffffee0;
  checkTestMessageAllZero(builder_00);
  if ((local_1f0.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37e,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  if (local_1f0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1f0);
  }
  local_190.pointer = local_178.pointers + 7;
  local_190.segment = local_178.segment;
  local_190.capTable = local_178.capTable;
  PointerBuilder::disown((OrphanBuilder *)&local_1c8,&local_190);
  local_1f0.capTable = (CapTableBuilder *)local_1c8.ptr;
  local_1f0.location = (word *)CONCAT44(local_1c8.step,local_1c8.elementCount);
  local_1f0.tag.content = (uint64_t)local_1c8.segment;
  local_1f0.segment = (SegmentBuilder *)local_1c8.capTable;
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,899,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::asListReader(&local_1c8,&local_1f0,FOUR_BYTES);
  if ((local_1c8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_190.segment = (SegmentBuilder *)((ulong)local_190.segment & 0xffffffff00000000);
    OrphanBuilder::asListReader(&local_1c8,&local_1f0,FOUR_BYTES);
    local_1cc = local_1c8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x385,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",
               (int *)&local_190,&local_1cc);
  }
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x386,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::asList((ListBuilder *)&local_1c8,&local_1f0,FOUR_BYTES);
  if ((local_1c8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_190.segment = (SegmentBuilder *)((ulong)local_190.segment & 0xffffffff00000000);
    OrphanBuilder::asList((ListBuilder *)&local_1c8,&local_1f0,FOUR_BYTES);
    local_1cc = local_1c8.elementCount;
    kj::_::Debug::log<char_const(&)[46],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x388,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", 0, orphan.get().size()",
               (char (*) [46])"failed: expected (0) == (orphan.get().size())",(int *)&local_190,
               &local_1cc);
  }
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x389,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  if (local_1f0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1f0);
  }
  local_190.pointer = local_178.pointers + 0x11;
  local_190.segment = local_178.segment;
  local_190.capTable = local_178.capTable;
  PointerBuilder::disown((OrphanBuilder *)&local_1c8,&local_190);
  local_1f0.capTable = (CapTableBuilder *)local_1c8.ptr;
  local_1f0.location = (word *)CONCAT44(local_1c8.step,local_1c8.elementCount);
  local_1f0.tag.content = (uint64_t)local_1c8.segment;
  local_1f0.segment = (SegmentBuilder *)local_1c8.capTable;
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x38e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::asListReader(&local_1c8,&local_1f0,INLINE_COMPOSITE);
  if ((local_1c8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_190.segment = (SegmentBuilder *)((ulong)local_190.segment & 0xffffffff00000000);
    OrphanBuilder::asListReader(&local_1c8,&local_1f0,INLINE_COMPOSITE);
    local_1cc = local_1c8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x390,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",
               (int *)&local_190,&local_1cc);
  }
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x391,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::asStructList((ListBuilder *)&local_1c8,&local_1f0,(StructSize)0x140006);
  if ((local_1c8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_190.segment = (SegmentBuilder *)((ulong)local_190.segment & 0xffffffff00000000);
    OrphanBuilder::asStructList((ListBuilder *)&local_1c8,&local_1f0,(StructSize)0x140006);
    local_1cc = local_1c8.elementCount;
    kj::_::Debug::log<char_const(&)[46],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x393,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", 0, orphan.get().size()",
               (char (*) [46])"failed: expected (0) == (orphan.get().size())",(int *)&local_190,
               &local_1cc);
  }
  if ((local_1f0.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x394,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  if (local_1f0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1f0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, DisownNull) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphan<TestAllTypes> orphan = root.disownStructField();
    EXPECT_TRUE(orphan == nullptr);

    checkTestMessageAllZero(orphan.getReader());
    EXPECT_TRUE(orphan == nullptr);

    // get()ing the orphan allocates an object, for security reasons.
    checkTestMessageAllZero(orphan.get());
    EXPECT_FALSE(orphan == nullptr);
  }

  {
    Orphan<List<int32_t>> orphan = root.disownInt32List();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }

  {
    Orphan<List<TestAllTypes>> orphan = root.disownStructList();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }
}